

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_stream.cpp
# Opt level: O1

ssize_t __thiscall dap::ContentWriter::write(ContentWriter *this,int __fd,void *__buf,size_t __n)

{
  element_type *peVar1;
  bool bVar2;
  char cVar3;
  char cVar4;
  uint uVar5;
  undefined8 *puVar6;
  long *plVar7;
  ulong uVar8;
  long *plVar9;
  ulong uVar10;
  undefined4 in_register_00000034;
  undefined8 *puVar11;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> header;
  ulong *local_a8;
  uint local_a0;
  undefined4 uStack_9c;
  ulong local_98 [2];
  long *local_88;
  undefined8 local_80;
  long local_78;
  undefined8 uStack_70;
  ulong *local_68;
  long local_60;
  ulong local_58 [2];
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  
  puVar11 = (undefined8 *)CONCAT44(in_register_00000034,__fd);
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Content-Length: ","");
  uVar10 = puVar11[1];
  cVar4 = '\x01';
  if (9 < uVar10) {
    uVar8 = uVar10;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar8 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_00806da2;
      }
      if (uVar8 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_00806da2;
      }
      if (uVar8 < 10000) goto LAB_00806da2;
      bVar2 = 99999 < uVar8;
      uVar8 = uVar8 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_00806da2:
  local_a8 = local_98;
  std::__cxx11::string::_M_construct((ulong)&local_a8,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_a8,local_a0,uVar10);
  uVar10 = CONCAT44(uStack_9c,local_a0) + local_60;
  uVar8 = 0xf;
  if (local_68 != local_58) {
    uVar8 = local_58[0];
  }
  if (uVar8 < uVar10) {
    uVar8 = 0xf;
    if (local_a8 != local_98) {
      uVar8 = local_98[0];
    }
    if (uVar10 <= uVar8) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,(ulong)local_68);
      goto LAB_00806e1f;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_a8);
LAB_00806e1f:
  local_88 = &local_78;
  plVar7 = puVar6 + 2;
  if ((long *)*puVar6 == plVar7) {
    local_78 = *plVar7;
    uStack_70 = puVar6[3];
  }
  else {
    local_78 = *plVar7;
    local_88 = (long *)*puVar6;
  }
  local_80 = puVar6[1];
  *puVar6 = plVar7;
  puVar6[1] = 0;
  *(undefined1 *)plVar7 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_88);
  plVar9 = plVar7 + 2;
  if ((long *)*plVar7 == plVar9) {
    local_38 = *plVar9;
    lStack_30 = plVar7[3];
    local_48 = &local_38;
  }
  else {
    local_38 = *plVar9;
    local_48 = (long *)*plVar7;
  }
  local_40 = plVar7[1];
  *plVar7 = (long)plVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  peVar1 = (this->writer).super___shared_ptr<dap::Writer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  cVar4 = (**(code **)((long)*peVar1 + 0x20))(peVar1,local_48,local_40);
  if (cVar4 == '\0') {
    uVar10 = 0;
  }
  else {
    peVar1 = (this->writer).super___shared_ptr<dap::Writer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar5 = (**(code **)((long)*peVar1 + 0x20))(peVar1,*puVar11,puVar11[1]);
    uVar10 = (ulong)uVar5;
  }
  if (local_48 != &local_38) {
    operator_delete(local_48,local_38 + 1);
  }
  return uVar10;
}

Assistant:

bool ContentWriter::write(const std::string& msg) const {
  auto header =
      std::string("Content-Length: ") + std::to_string(msg.size()) + "\r\n\r\n";
  return writer->write(header.data(), header.size()) &&
         writer->write(msg.data(), msg.size());
}